

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O3

void dumpFunction(DumpState *D,Proto *f)

{
  TValue *pTVar1;
  int iVar2;
  ulong in_RAX;
  size_t sVar3;
  TString *ts;
  byte bVar4;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  bool bVar8;
  lu_byte x;
  ulong local_38;
  
  local_38 = in_RAX;
  dumpVarint(D,(long)f->linedefined);
  dumpVarint(D,(long)f->lastlinedefined);
  local_38 = CONCAT71(local_38._1_7_,f->numparams);
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
    D->status = iVar2;
    D->offset = D->offset + 1;
    local_38 = CONCAT71(local_38._1_7_,f->flag);
    if (iVar2 == 0) {
      iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
      D->status = iVar2;
      D->offset = D->offset + 1;
      local_38 = CONCAT71(local_38._1_7_,f->maxstacksize);
      if (iVar2 == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
        D->offset = D->offset + 1;
      }
    }
  }
  sVar3 = (size_t)f->sizecode;
  dumpVarint(D,sVar3);
  dumpAlign(D,(uint)sVar3);
  if (D->status == 0) {
    sVar3 = (ulong)(uint)f->sizecode * 4;
    iVar2 = (*D->writer)(D->L,f->code,sVar3,D->data);
    D->status = iVar2;
    D->offset = D->offset + sVar3;
  }
  sVar3 = (size_t)f->sizek;
  dumpVarint(D,sVar3);
  if (0 < (long)sVar3) {
    lVar6 = 0;
    do {
      pTVar1 = f->k;
      bVar4 = (&pTVar1->tt_)[lVar6] & 0x3f;
      local_38 = CONCAT71(local_38._1_7_,(&pTVar1->tt_)[lVar6]) & 0xffffffffffffff3f;
      if (D->status == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
        D->offset = D->offset + 1;
        bVar8 = iVar2 == 0;
      }
      else {
        bVar8 = false;
      }
      if (bVar4 < 0x13) {
        if (bVar4 == 3) {
          local_38 = *(ulong *)((long)&pTVar1->value_ + lVar6);
LAB_0010d55f:
          if (bVar8) {
            iVar2 = (*D->writer)(D->L,&local_38,8,D->data);
            D->status = iVar2;
            D->offset = D->offset + 8;
          }
        }
        else if (bVar4 == 4) goto LAB_0010d547;
      }
      else {
        if (bVar4 != 0x14) {
          if (bVar4 != 0x13) goto LAB_0010d57d;
          local_38 = *(ulong *)((long)&pTVar1->value_ + lVar6);
          goto LAB_0010d55f;
        }
LAB_0010d547:
        dumpString(D,*(TString **)((long)&pTVar1->value_ + lVar6));
      }
LAB_0010d57d:
      lVar6 = lVar6 + 0x10;
    } while (sVar3 * 0x10 != lVar6);
  }
  sVar3 = (size_t)f->sizeupvalues;
  dumpVarint(D,sVar3);
  if (0 < (long)sVar3) {
    iVar2 = D->status;
    lVar6 = 0;
    do {
      local_38 = CONCAT71(local_38._1_7_,(&f->upvalues->instack)[lVar6]);
      if (iVar2 == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
        D->offset = D->offset + 1;
        local_38 = CONCAT71(local_38._1_7_,(&f->upvalues->idx)[lVar6]);
        if (iVar2 == 0) {
          iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
          D->status = iVar2;
          D->offset = D->offset + 1;
          local_38 = CONCAT71(local_38._1_7_,(&f->upvalues->kind)[lVar6]);
          if (iVar2 == 0) {
            iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
            D->status = iVar2;
            D->offset = D->offset + 1;
          }
        }
      }
      lVar6 = lVar6 + 0x10;
    } while (sVar3 * 0x10 != lVar6);
  }
  sVar3 = (size_t)f->sizep;
  dumpVarint(D,sVar3);
  if (0 < (long)sVar3) {
    sVar5 = 0;
    do {
      dumpFunction(D,f->p[sVar5]);
      sVar5 = sVar5 + 1;
    } while (sVar3 != sVar5);
  }
  uVar7 = 0;
  if (D->strip == 0) {
    ts = f->source;
  }
  else {
    ts = (TString *)0x0;
  }
  dumpString(D,ts);
  if (D->strip == 0) {
    uVar7 = f->sizelineinfo;
  }
  dumpVarint(D,(long)(int)uVar7);
  if ((f->lineinfo != (ls_byte *)0x0) && (D->status == 0)) {
    iVar2 = (*D->writer)(D->L,f->lineinfo,(ulong)uVar7,D->data);
    D->status = iVar2;
    D->offset = D->offset + (ulong)uVar7;
  }
  if (D->strip == 0) {
    sVar5 = (size_t)f->sizeabslineinfo;
    sVar3 = sVar5;
    dumpVarint(D,sVar5);
    if ((0 < (long)sVar5) && (dumpAlign(D,(uint)sVar3), D->status == 0)) {
      iVar2 = (*D->writer)(D->L,f->abslineinfo,sVar5 * 8,D->data);
      D->status = iVar2;
      D->offset = D->offset + sVar5 * 8;
    }
  }
  else {
    dumpVarint(D,0);
  }
  if (D->strip == 0) {
    sVar3 = (size_t)f->sizelocvars;
    dumpVarint(D,sVar3);
    if (0 < (long)sVar3) {
      lVar6 = 0;
      do {
        dumpString(D,*(TString **)((long)&f->locvars->varname + lVar6));
        dumpVarint(D,(long)*(int *)((long)&f->locvars->startpc + lVar6));
        dumpVarint(D,(long)*(int *)((long)&f->locvars->endpc + lVar6));
        lVar6 = lVar6 + 0x10;
      } while (sVar3 * 0x10 != lVar6);
    }
  }
  else {
    dumpVarint(D,0);
  }
  if (D->strip == 0) {
    sVar3 = (size_t)f->sizeupvalues;
    dumpVarint(D,sVar3);
    if (0 < (long)sVar3) {
      lVar6 = 0;
      do {
        dumpString(D,*(TString **)((long)&f->upvalues->name + lVar6));
        lVar6 = lVar6 + 0x10;
      } while (sVar3 * 0x10 != lVar6);
    }
  }
  else {
    dumpVarint(D,0);
  }
  return;
}

Assistant:

static void dumpFunction (DumpState *D, const Proto *f) {
  dumpInt(D, f->linedefined);
  dumpInt(D, f->lastlinedefined);
  dumpByte(D, f->numparams);
  dumpByte(D, f->flag);
  dumpByte(D, f->maxstacksize);
  dumpCode(D, f);
  dumpConstants(D, f);
  dumpUpvalues(D, f);
  dumpProtos(D, f);
  dumpString(D, D->strip ? NULL : f->source);
  dumpDebug(D, f);
}